

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void bestOrClauseIndex(WhereBestIdx *p)

{
  int iVar1;
  int iVar2;
  WhereClause *pWVar3;
  SrcList_item *pSVar4;
  WhereOrInfo *pWVar5;
  Expr **ppEVar6;
  u16 uVar7;
  long lVar8;
  long lVar9;
  WhereBestIdx *pWVar10;
  ulong uVar11;
  WhereBestIdx *pWVar12;
  Bitmask BVar13;
  Index *pIVar14;
  WhereTerm *pWVar15;
  WhereTerm *pWVar16;
  byte bVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  WhereBestIdx local_2a0;
  Parse *local_228;
  WhereMaskSet *pWStack_220;
  WhereClause *local_218;
  undefined1 local_210;
  undefined2 local_20e;
  undefined4 local_20c;
  WhereTerm *local_200;
  
  bVar17 = 0;
  pWVar3 = p->pWC;
  pSVar4 = p->pSrc;
  iVar1 = pSVar4->iCursor;
  lVar9 = (long)pWVar3->pMaskSet->n;
  uVar11 = 0;
  if (0 < lVar9) {
    lVar8 = 0;
    do {
      if (pWVar3->pMaskSet->ix[lVar8] == iVar1) {
        uVar11 = 1L << ((byte)lVar8 & 0x3f);
        break;
      }
      lVar8 = lVar8 + 1;
    } while (lVar9 != lVar8);
  }
  if ((((pSVar4->field_0x39 & 1) == 0) && (pSVar4->pIndex == (Index *)0x0)) &&
     (iVar2 = pWVar3->nTerm, 0 < iVar2 && (pWVar3->wctrlFlags & 0x80) == 0)) {
    pIVar14 = (Index *)pWVar3->a;
    ppEVar6 = (Expr **)&pIVar14->zName;
    do {
      if (((((ulong)pIVar14->pTable & 0x100) != 0) &&
          ((p->notReady & (ulong)pIVar14->pSchema & ~uVar11) == 0)) &&
         (pWVar5 = ((anon_union_8_3_737c4e49_for_u *)&pIVar14->aiRowEst)->pOrInfo,
         (pWVar5->indexable & uVar11) != 0)) {
        pWVar15 = (pWVar5->wc).a + (pWVar5->wc).nTerm;
        pWVar10 = p;
        pWVar12 = &local_2a0;
        for (lVar9 = 0xf; lVar9 != 0; lVar9 = lVar9 + -1) {
          pWVar12->pParse = pWVar10->pParse;
          pWVar10 = (WhereBestIdx *)((long)pWVar10 + (ulong)bVar17 * -0x10 + 8);
          pWVar12 = (WhereBestIdx *)((long)pWVar12 + ((ulong)bVar17 * -2 + 1) * 8);
        }
        local_2a0.pOrderBy = (ExprList *)0x0;
        local_2a0.pDistinct = (ExprList *)0x0;
        local_2a0.ppIdxInfo = (sqlite3_index_info **)0x0;
        pWVar16 = (pWVar5->wc).a;
        if (pWVar16 < pWVar15) {
          dVar20 = 0.0;
          BVar13 = 0;
          dVar21 = 0.0;
          do {
            if ((pWVar16->eOperator & 0x200) == 0) {
              if (pWVar16->leftCursor == iVar1) {
                local_228 = pWVar3->pParse;
                pWStack_220 = pWVar3->pMaskSet;
                local_210 = 0x45;
                local_20e = 0;
                local_20c = 1;
                local_2a0.pWC = (WhereClause *)&local_228;
                local_218 = pWVar3;
                local_200 = pWVar16;
                goto LAB_0016bcc1;
              }
            }
            else {
              local_2a0.pWC = *(WhereClause **)&pWVar16->u;
LAB_0016bcc1:
              bestIndex(&local_2a0);
              dVar21 = dVar21 + local_2a0.cost.rCost;
              dVar20 = dVar20 + local_2a0.cost.plan.nRow;
              BVar13 = BVar13 | local_2a0.cost.used;
              if ((p->cost).rCost <= dVar21) break;
            }
            pWVar16 = pWVar16 + 1;
          } while (pWVar16 < pWVar15);
          if (p->pOrderBy != (ExprList *)0x0) {
            if (dVar20 <= 10.0) {
              dVar18 = 1.0;
            }
            else {
              dVar19 = 10.0;
              dVar18 = 1.0;
              do {
                dVar18 = dVar18 + 1.0;
                dVar19 = dVar19 * 10.0;
              } while (dVar19 < dVar20);
            }
LAB_0016bd8d:
            dVar21 = dVar21 + dVar18 * dVar20;
          }
        }
        else {
          dVar21 = 0.0;
          dVar20 = 0.0;
          BVar13 = 0;
          dVar18 = 1.0;
          if (p->pOrderBy != (ExprList *)0x0) goto LAB_0016bd8d;
        }
        if (dVar21 < (p->cost).rCost) {
          (p->cost).rCost = dVar21;
          (p->cost).used = BVar13;
          (p->cost).plan.nRow = dVar20;
          if ((long)p->i == 0) {
            uVar7 = 0;
          }
          else {
            uVar7 = p->aLevel[(long)p->i + -1].plan.nOBSat;
          }
          (p->cost).plan.nOBSat = uVar7;
          (p->cost).plan.wsFlags = 0x10000000;
          (p->cost).plan.u.pIdx = pIVar14;
        }
      }
      pIVar14 = (Index *)&pIVar14->aSortOrder;
    } while (pIVar14 < ppEVar6 + (long)iVar2 * 7);
  }
  return;
}

Assistant:

static void bestOrClauseIndex(WhereBestIdx *p){
#ifndef SQLITE_OMIT_OR_OPTIMIZATION
  WhereClause *pWC = p->pWC;           /* The WHERE clause */
  struct SrcList_item *pSrc = p->pSrc; /* The FROM clause term to search */
  const int iCur = pSrc->iCursor;      /* The cursor of the table  */
  const Bitmask maskSrc = getMask(pWC->pMaskSet, iCur);  /* Bitmask for pSrc */
  WhereTerm * const pWCEnd = &pWC->a[pWC->nTerm];        /* End of pWC->a[] */
  WhereTerm *pTerm;                    /* A single term of the WHERE clause */

  /* The OR-clause optimization is disallowed if the INDEXED BY or
  ** NOT INDEXED clauses are used or if the WHERE_AND_ONLY bit is set. */
  if( pSrc->notIndexed || pSrc->pIndex!=0 ){
    return;
  }
  if( pWC->wctrlFlags & WHERE_AND_ONLY ){
    return;
  }

  /* Search the WHERE clause terms for a usable WO_OR term. */
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    if( (pTerm->eOperator & WO_OR)!=0
     && ((pTerm->prereqAll & ~maskSrc) & p->notReady)==0
     && (pTerm->u.pOrInfo->indexable & maskSrc)!=0 
    ){
      WhereClause * const pOrWC = &pTerm->u.pOrInfo->wc;
      WhereTerm * const pOrWCEnd = &pOrWC->a[pOrWC->nTerm];
      WhereTerm *pOrTerm;
      int flags = WHERE_MULTI_OR;
      double rTotal = 0;
      double nRow = 0;
      Bitmask used = 0;
      WhereBestIdx sBOI;

      sBOI = *p;
      sBOI.pOrderBy = 0;
      sBOI.pDistinct = 0;
      sBOI.ppIdxInfo = 0;
      for(pOrTerm=pOrWC->a; pOrTerm<pOrWCEnd; pOrTerm++){
        WHERETRACE(("... Multi-index OR testing for term %d of %d....\n", 
          (pOrTerm - pOrWC->a), (pTerm - pWC->a)
        ));
        if( (pOrTerm->eOperator& WO_AND)!=0 ){
          sBOI.pWC = &pOrTerm->u.pAndInfo->wc;
          bestIndex(&sBOI);
        }else if( pOrTerm->leftCursor==iCur ){
          WhereClause tempWC;
          tempWC.pParse = pWC->pParse;
          tempWC.pMaskSet = pWC->pMaskSet;
          tempWC.pOuter = pWC;
          tempWC.op = TK_AND;
          tempWC.a = pOrTerm;
          tempWC.wctrlFlags = 0;
          tempWC.nTerm = 1;
          sBOI.pWC = &tempWC;
          bestIndex(&sBOI);
        }else{
          continue;
        }
        rTotal += sBOI.cost.rCost;
        nRow += sBOI.cost.plan.nRow;
        used |= sBOI.cost.used;
        if( rTotal>=p->cost.rCost ) break;
      }

      /* If there is an ORDER BY clause, increase the scan cost to account 
      ** for the cost of the sort. */
      if( p->pOrderBy!=0 ){
        WHERETRACE(("... sorting increases OR cost %.9g to %.9g\n",
                    rTotal, rTotal+nRow*estLog(nRow)));
        rTotal += nRow*estLog(nRow);
      }

      /* If the cost of scanning using this OR term for optimization is
      ** less than the current cost stored in pCost, replace the contents
      ** of pCost. */
      WHERETRACE(("... multi-index OR cost=%.9g nrow=%.9g\n", rTotal, nRow));
      if( rTotal<p->cost.rCost ){
        p->cost.rCost = rTotal;
        p->cost.used = used;
        p->cost.plan.nRow = nRow;
        p->cost.plan.nOBSat = p->i ? p->aLevel[p->i-1].plan.nOBSat : 0;
        p->cost.plan.wsFlags = flags;
        p->cost.plan.u.pTerm = pTerm;
      }
    }
  }
#endif /* SQLITE_OMIT_OR_OPTIMIZATION */
}